

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O0

Vector3 * AML::cross(Vector3 *__return_storage_ptr__,Vector3 *lhs,Vector3 *rhs)

{
  double z;
  double y;
  double x;
  Vector3 *rhs_local;
  Vector3 *lhs_local;
  
  Vector3::Vector3(__return_storage_ptr__,
                   (lhs->field_0).data[1] * (rhs->field_0).data[2] +
                   -((lhs->field_0).data[2] * (rhs->field_0).data[1]),
                   (lhs->field_0).data[2] * (rhs->field_0).data[0] +
                   -((lhs->field_0).data[0] * (rhs->field_0).data[2]),
                   (lhs->field_0).data[0] * (rhs->field_0).data[1] +
                   -((lhs->field_0).data[1] * (rhs->field_0).data[0]));
  return __return_storage_ptr__;
}

Assistant:

Vector3 cross(const Vector3& lhs, const Vector3& rhs)
    {
        double x = (lhs.y * rhs.z) - (lhs.z * rhs.y);
        double y = (lhs.z * rhs.x) - (lhs.x * rhs.z);
        double z = (lhs.x * rhs.y) - (lhs.y * rhs.x);
        return Vector3(x, y, z);
    }